

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

void __thiscall
capnp::compiler::CompilerMain::addGlobalOptions(CompilerMain *this,MainBuilder *builder)

{
  StringPtr helpText;
  MainBuilder *this_00;
  initializer_list<kj::MainBuilder::OptionName> names;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  StringPtr argumentTitle;
  StringPtr helpText_00;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface> local_a0;
  OptionName local_90;
  char *local_80;
  undefined8 uStack_78;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface> local_70;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:289:47),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:289:47)>
  local_60;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:286:52),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:286:52)>
  local_50;
  OptionName local_40;
  undefined1 local_30;
  char *local_28;
  
  local_40.isLong = false;
  local_40.field_1.shortName = 'I';
  local_30 = 1;
  local_28 = "import-path";
  local_50.t = this;
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addGlobalOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::addGlobalOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_70,&local_50);
  local_80 = 
  "Add <dir> to the list of directories searched for non-relative imports (ones that start with a \'/\')."
  ;
  uStack_78 = 0x65;
  helpText.content.size_ = 0x65;
  helpText.content.ptr =
       "Add <dir> to the list of directories searched for non-relative imports (ones that start with a \'/\')."
  ;
  names._M_len = 2;
  names._M_array = &local_40;
  argumentTitle.content.size_ = 6;
  argumentTitle.content.ptr = "<dir>";
  this_00 = kj::MainBuilder::addOptionWithArg
                      (builder,names,
                       (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)&local_70,
                       argumentTitle,helpText);
  local_90.isLong = true;
  local_90.field_1.longName = "no-standard-import";
  local_60.t = this;
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addGlobalOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::addGlobalOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_4_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_a0,&local_60);
  names_00._M_len = 1;
  names_00._M_array = &local_90;
  helpText_00.content.size_ = 0x95;
  helpText_00.content.ptr =
       "Do not add any default import paths; use only those specified by -I.  Otherwise, typically /usr/include and /usr/local/include are added by default."
  ;
  kj::MainBuilder::addOption
            (this_00,names_00,(Function<kj::MainBuilder::Validity_()> *)&local_a0,helpText_00);
  kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface>::dispose(&local_a0);
  kj::Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface>::dispose(&local_70);
  return;
}

Assistant:

void addGlobalOptions(kj::MainBuilder& builder) {
    builder.addOptionWithArg({'I', "import-path"}, KJ_BIND_METHOD(*this, addImportPath), "<dir>",
                             "Add <dir> to the list of directories searched for non-relative "
                             "imports (ones that start with a '/').")
           .addOption({"no-standard-import"}, KJ_BIND_METHOD(*this, noStandardImport),
                      "Do not add any default import paths; use only those specified by -I.  "
                      "Otherwise, typically /usr/include and /usr/local/include are added by "
                      "default.");
  }